

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O0

int ffshft(fitsfile *fptr,LONGLONG firstbyte,LONGLONG nbytes,LONGLONG nshift,int *status)

{
  int iVar1;
  long lStack_18708;
  long lStack_18700;
  undefined1 auStack_186f8 [8];
  char buffer [100000];
  long local_50;
  LONGLONG ntodo;
  LONGLONG ptr;
  long ntomov;
  int *status_local;
  LONGLONG nshift_local;
  LONGLONG nbytes_local;
  LONGLONG firstbyte_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    local_50 = nbytes;
    ntodo = firstbyte;
    if (0 < nshift) {
      ntodo = firstbyte + nbytes;
    }
    while (local_50 != 0) {
      if (local_50 < 100000) {
        lStack_18700 = local_50;
      }
      else {
        lStack_18700 = 100000;
      }
      if (0 < nshift) {
        ntodo = ntodo - lStack_18700;
      }
      ffmbyt(fptr,ntodo,0,status);
      ffgbyt(fptr,lStack_18700,auStack_186f8,status);
      ffmbyt(fptr,ntodo + nshift,1,status);
      iVar1 = ffpbyt(fptr,lStack_18700,auStack_186f8,status);
      if (0 < iVar1) {
        ffpmsg("Error while shifting block (ffshft)");
        return *status;
      }
      local_50 = local_50 - lStack_18700;
      if (nshift < 0) {
        ntodo = lStack_18700 + ntodo;
      }
    }
    if (fptr->Fptr->hdutype == 1) {
      memset(auStack_186f8,0x20,100000);
    }
    else {
      memset(auStack_186f8,0,100000);
    }
    local_50 = nshift;
    ntodo = firstbyte;
    if (nshift < 0) {
      local_50 = -nshift;
      ntodo = firstbyte + nbytes + nshift;
    }
    ffmbyt(fptr,ntodo,0,status);
    for (; local_50 != 0; local_50 = local_50 - lStack_18708) {
      if (local_50 < 100000) {
        lStack_18708 = local_50;
      }
      else {
        lStack_18708 = 100000;
      }
      ffpbyt(fptr,lStack_18708,auStack_186f8,status);
    }
    fptr_local._4_4_ = *status;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffshft(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG firstbyte, /* I - position of first byte in block to shift */
           LONGLONG nbytes,    /* I - size of block of bytes to shift          */
           LONGLONG nshift,    /* I - size of shift in bytes (+ or -)          */
           int *status)     /* IO - error status                            */
/*
    Shift block of bytes by nshift bytes (positive or negative).
    A positive nshift value moves the block down further in the file, while a
    negative value shifts the block towards the beginning of the file.
*/
{
#define shftbuffsize 100000
    long ntomov;
    LONGLONG ptr, ntodo;
    char buffer[shftbuffsize];

    if (*status > 0)
        return(*status);

    ntodo = nbytes;   /* total number of bytes to shift */

    if (nshift > 0)
            /* start at the end of the block and work backwards */
            ptr = firstbyte + nbytes;
    else
            /* start at the beginning of the block working forwards */
            ptr = firstbyte;

    while (ntodo)
    {
        /* number of bytes to move at one time */
        ntomov = (long) (minvalue(ntodo, shftbuffsize));

        if (nshift > 0)     /* if moving block down ... */
            ptr -= ntomov;

        /* move to position and read the bytes to be moved */

        ffmbyt(fptr, ptr, REPORT_EOF, status);
        ffgbyt(fptr, ntomov, buffer, status);

        /* move by shift amount and write the bytes */
        ffmbyt(fptr, ptr + nshift, IGNORE_EOF, status);
        if (ffpbyt(fptr, ntomov, buffer, status) > 0)
        {
           ffpmsg("Error while shifting block (ffshft)");
           return(*status);
        }

        ntodo -= ntomov;
        if (nshift < 0)     /* if moving block up ... */
            ptr += ntomov;
    }

    /* now overwrite the old data with fill */
    if ((fptr->Fptr)->hdutype == ASCII_TBL)
       memset(buffer, 32, shftbuffsize); /* fill ASCII tables with spaces */
    else
       memset(buffer,  0, shftbuffsize); /* fill other HDUs with zeros */


    if (nshift < 0)
    {
        ntodo = -nshift;
        /* point to the end of the shifted block */
        ptr = firstbyte + nbytes + nshift;
    }
    else
    {
        ntodo = nshift;
        /* point to original beginning of the block */
        ptr = firstbyte;
    }

    ffmbyt(fptr, ptr, REPORT_EOF, status);

    while (ntodo)
    {
        ntomov = (long) (minvalue(ntodo, shftbuffsize));
        ffpbyt(fptr, ntomov, buffer, status);
        ntodo -= ntomov;
    }
    return(*status);
}